

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void BM_Check2(int n)

{
  ostream *poVar1;
  int iVar2;
  LogMessage local_358;
  LogMessageVoidify local_2f2;
  byte local_2f1;
  LogMessage local_2f0;
  LogMessageVoidify local_28a;
  byte local_289;
  LogMessage local_288;
  LogMessageVoidify local_222;
  byte local_221;
  LogMessage local_220;
  LogMessageVoidify local_1ba;
  byte local_1b9;
  LogMessage local_1b8;
  LogMessageVoidify local_152;
  byte local_151;
  LogMessage local_150;
  LogMessageVoidify local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogMessageVoidify local_85 [20];
  byte local_71;
  LogMessage local_70;
  LogMessageVoidify local_d;
  int local_c;
  int n_local;
  
  local_c = n;
  if (n == 0x11) {
    x = 5;
  }
  while( true ) {
    iVar2 = local_c + -1;
    if (local_c < 1) {
      return;
    }
    local_71 = 0;
    local_c = iVar2;
    if (iVar2 < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_d);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x9e);
      local_71 = 1;
      poVar1 = google::LogMessage::stream(&local_70);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_d,poVar1);
    }
    if ((local_71 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
    }
    local_e9 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(local_85);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x9f);
      local_e9 = 1;
      poVar1 = google::LogMessage::stream(&local_e8);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(local_85,poVar1);
    }
    if ((local_e9 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e8);
    }
    local_151 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_ea);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_150,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa0);
      local_151 = 1;
      poVar1 = google::LogMessage::stream(&local_150);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_ea,poVar1);
    }
    if ((local_151 & 1) != 0) break;
    local_1b9 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_152);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa1);
      local_1b9 = 1;
      poVar1 = google::LogMessage::stream(&local_1b8);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_152,poVar1);
    }
    if ((local_1b9 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    }
    local_221 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_1ba);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_220,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa2);
      local_221 = 1;
      poVar1 = google::LogMessage::stream(&local_220);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_1ba,poVar1);
    }
    if ((local_221 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_220);
    }
    local_289 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_222);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_288,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa3);
      local_289 = 1;
      poVar1 = google::LogMessage::stream(&local_288);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_222,poVar1);
    }
    if ((local_289 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
    }
    local_2f1 = 0;
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_28a);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa4);
      local_2f1 = 1;
      poVar1 = google::LogMessage::stream(&local_2f0);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_28a,poVar1);
    }
    if ((local_2f1 & 1) != 0) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2f0);
    }
    if (local_c < x) {
      google::LogMessageVoidify::LogMessageVoidify(&local_2f2);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_358,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xa5);
      poVar1 = google::LogMessage::stream(&local_358);
      poVar1 = std::operator<<(poVar1,"Check failed: n >= x ");
      google::LogMessageVoidify::operator&(&local_2f2,poVar1);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_358);
    }
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_150);
}

Assistant:

static void BM_Check2(int n) {
  if (n == 17) {
    x = 5;
  }
  while (n-- > 0) {
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
    CHECK(n >= x);
  }
}